

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawListSplitter::Split(ImDrawListSplitter *this,ImDrawList *draw_list,int channels_count)

{
  int iVar1;
  ImDrawChannel *__s;
  int in_EDX;
  long in_RDI;
  int i;
  int old_channels_count;
  ImDrawChannel *in_stack_ffffffffffffffb8;
  int new_size;
  ImVector<ImDrawCmd> *in_stack_ffffffffffffffc0;
  ImDrawChannel *in_stack_ffffffffffffffd0;
  int local_1c;
  
  iVar1 = *(int *)(in_RDI + 8);
  if (iVar1 < in_EDX) {
    ImVector<ImDrawChannel>::reserve
              ((ImVector<ImDrawChannel> *)in_stack_ffffffffffffffd0,(int)((ulong)in_RDI >> 0x20));
    ImVector<ImDrawChannel>::resize
              ((ImVector<ImDrawChannel> *)in_stack_ffffffffffffffc0,
               (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20));
  }
  *(int *)(in_RDI + 4) = in_EDX;
  __s = ImVector<ImDrawChannel>::operator[]((ImVector<ImDrawChannel> *)(in_RDI + 8),0);
  memset(__s,0,0x20);
  for (local_1c = 1; local_1c < in_EDX; local_1c = local_1c + 1) {
    if (local_1c < iVar1) {
      ImVector<ImDrawChannel>::operator[]((ImVector<ImDrawChannel> *)(in_RDI + 8),local_1c);
      new_size = (int)((ulong)in_stack_ffffffffffffffb8 >> 0x20);
      ImVector<ImDrawCmd>::resize(in_stack_ffffffffffffffc0,new_size);
      ImVector<ImDrawChannel>::operator[]((ImVector<ImDrawChannel> *)(in_RDI + 8),local_1c);
      ImVector<unsigned_int>::resize((ImVector<unsigned_int> *)in_stack_ffffffffffffffc0,new_size);
    }
    else {
      in_stack_ffffffffffffffb8 =
           ImVector<ImDrawChannel>::operator[]((ImVector<ImDrawChannel> *)(in_RDI + 8),local_1c);
      in_stack_ffffffffffffffc0 = (ImVector<ImDrawCmd> *)operator_new(0x20);
      in_stack_ffffffffffffffc0[1].Size = 0;
      in_stack_ffffffffffffffc0[1].Capacity = 0;
      in_stack_ffffffffffffffc0[1].Data = (ImDrawCmd *)0x0;
      in_stack_ffffffffffffffc0->Size = 0;
      in_stack_ffffffffffffffc0->Capacity = 0;
      in_stack_ffffffffffffffc0->Data = (ImDrawCmd *)0x0;
      ImDrawChannel::ImDrawChannel(in_stack_ffffffffffffffd0);
    }
  }
  return;
}

Assistant:

void ImDrawListSplitter::Split(ImDrawList* draw_list, int channels_count)
{
    IM_UNUSED(draw_list);
    IM_ASSERT(_Current == 0 && _Count <= 1 && "Nested channel splitting is not supported. Please use separate instances of ImDrawListSplitter.");
    int old_channels_count = _Channels.Size;
    if (old_channels_count < channels_count)
    {
        _Channels.reserve(channels_count); // Avoid over reserving since this is likely to stay stable
        _Channels.resize(channels_count);
    }
    _Count = channels_count;

    // Channels[] (24/32 bytes each) hold storage that we'll swap with draw_list->_CmdBuffer/_IdxBuffer
    // The content of Channels[0] at this point doesn't matter. We clear it to make state tidy in a debugger but we don't strictly need to.
    // When we switch to the next channel, we'll copy draw_list->_CmdBuffer/_IdxBuffer into Channels[0] and then Channels[1] into draw_list->CmdBuffer/_IdxBuffer
    memset(&_Channels[0], 0, sizeof(ImDrawChannel));
    for (int i = 1; i < channels_count; i++)
    {
        if (i >= old_channels_count)
        {
            IM_PLACEMENT_NEW(&_Channels[i]) ImDrawChannel();
        }
        else
        {
            _Channels[i]._CmdBuffer.resize(0);
            _Channels[i]._IdxBuffer.resize(0);
        }
    }
}